

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

int libsgp4::DateTime::DaysInMonth(int year,int month)

{
  bool bVar1;
  undefined1 *local_18;
  int *daysInMonthPtr;
  int month_local;
  int year_local;
  
  bVar1 = IsValidYearMonth(year,month);
  if (!bVar1) {
    __assert_fail("false && \"Invalid year and month\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dnwrnr[P]sgp4/libsgp4/DateTime.h"
                  ,0x107,"static int libsgp4::DateTime::DaysInMonth(int, int)");
  }
  bVar1 = IsLeapYear(year);
  if (bVar1) {
    local_18 = (undefined1 *)0x118564;
  }
  else {
    local_18 = (anonymous_namespace)::daysInMonth;
  }
  return *(int *)(local_18 + (long)month * 4);
}

Assistant:

static int DaysInMonth(int year, int month)
    {
        if (!IsValidYearMonth(year, month))
        {
            assert(false && "Invalid year and month");
        }
        
        const int* daysInMonthPtr;

        if (IsLeapYear(year))
        {
            daysInMonthPtr = daysInMonth[1];
        }
        else
        {
            daysInMonthPtr = daysInMonth[0];
        }

        return daysInMonthPtr[month];
    }